

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-diag.c
# Opt level: O2

int fy_vdiag(fy_diag *diag,fy_diag_ctx *fydc,char *fmt,__va_list_tag *ap)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  char *pcVar13;
  char *pcVar14;
  fy_error_type fVar15;
  char *pcVar16;
  ulong uVar17;
  ulong uVar18;
  char *pcVar19;
  ulong uVar20;
  undefined8 uStack_80;
  undefined8 uStack_78;
  va_list _ap_orig;
  char *local_50;
  
  pcVar11 = (char *)&uStack_78;
  if (fmt == (char *)0x0 || (fydc == (fy_diag_ctx *)0x0 || diag == (fy_diag *)0x0)) {
    iVar5 = -1;
  }
  else {
    fVar15 = fydc->level;
    if ((FYET_WARNING < fVar15) && ((diag->field_0x3c & 1) != 0)) {
      fVar15 = FYET_NOTICE;
    }
    iVar5 = 0;
    if (((diag->cfg).level <= fVar15) &&
       (((diag->cfg).module_mask >> (fydc->module & 0x1f) & 1) != 0)) {
      _ap_orig[0].overflow_arg_area = ap->reg_save_area;
      uStack_78._0_4_ = ap->gp_offset;
      uStack_78._4_4_ = ap->fp_offset;
      _ap_orig[0]._0_8_ = ap->overflow_arg_area;
      local_50 = (char *)0x0;
      uStack_80 = 0x11a12c;
      iVar5 = vsnprintf((char *)0x0,0,fmt,&uStack_78);
      if (iVar5 != -1) {
        lVar4 = -((long)iVar5 + 0x10U & 0xfffffffffffffff0);
        pcVar11 = (char *)((long)_ap_orig + lVar4 + -8);
        *(undefined8 *)((long)&uStack_80 + lVar4) = 0x11a159;
        iVar6 = vsnprintf(pcVar11,(long)iVar5 + 1,fmt,ap);
        if (iVar5 != iVar6) {
          *(undefined8 *)((long)&uStack_80 + lVar4) = 0x11a5d0;
          __assert_fail("_size == _sizew",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-diag.c"
                        ,0x10a,
                        "int fy_vdiag(struct fy_diag *, const struct fy_diag_ctx *, const char *, struct __va_list_tag *)"
                       );
        }
        *(undefined8 *)((long)&uStack_80 + lVar4) = 0x11a16a;
        sVar7 = strlen(pcVar11);
        pcVar8 = pcVar11 + sVar7;
        while ((local_50 = pcVar11, pcVar11 < pcVar8 && (pcVar8[-1] == '\n'))) {
          pcVar8 = pcVar8 + -1;
          *pcVar8 = '\0';
        }
      }
      if (((diag->cfg).field_0x20 & 2) == 0) {
        pcVar8 = (char *)0x0;
      }
      else {
        pcVar8 = fydc->source_file;
        if (pcVar8 == (char *)0x0) {
          pcVar14 = "";
        }
        else {
          pcVar11[-8] = '/';
          pcVar11[-7] = '\0';
          pcVar11[-6] = '\0';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          uVar3 = *(undefined8 *)(pcVar11 + -8);
          pcVar11[-8] = -0x4e;
          pcVar11[-7] = -0x5f;
          pcVar11[-6] = '\x11';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          pcVar19 = strrchr(pcVar8,(int)uVar3);
          pcVar14 = pcVar19 + 1;
          if (pcVar19 == (char *)0x0) {
            pcVar14 = pcVar8;
          }
        }
        uVar1 = fydc->source_line;
        pcVar8 = fydc->source_func;
        *(char **)(pcVar11 + -0x10) = " ";
        pcVar11[-0x18] = -0xd;
        pcVar11[-0x17] = -0x5f;
        pcVar11[-0x16] = '\x11';
        pcVar11[-0x15] = '\0';
        pcVar11[-0x14] = '\0';
        pcVar11[-0x13] = '\0';
        pcVar11[-0x12] = '\0';
        pcVar11[-0x11] = '\0';
        iVar5 = snprintf((char *)0x0,0,"%s:%d @%s()%s",pcVar14,(ulong)uVar1,pcVar8);
        pcVar8 = (char *)0x0;
        if (iVar5 != -1) {
          pcVar11 = pcVar11 + -((long)iVar5 + 0x10U & 0xfffffffffffffff0);
          uVar1 = fydc->source_line;
          pcVar8 = fydc->source_func;
          *(char **)(pcVar11 + -0x10) = " ";
          pcVar11[-0x18] = '>';
          pcVar11[-0x17] = -0x5e;
          pcVar11[-0x16] = '\x11';
          pcVar11[-0x15] = '\0';
          pcVar11[-0x14] = '\0';
          pcVar11[-0x13] = '\0';
          pcVar11[-0x12] = '\0';
          pcVar11[-0x11] = '\0';
          iVar6 = snprintf(pcVar11,(long)iVar5 + 1,"%s:%d @%s()%s",pcVar14,(ulong)uVar1,pcVar8);
          if (iVar5 != iVar6) {
            pcVar11[-8] = -0x11;
            pcVar11[-7] = -0x5b;
            pcVar11[-6] = '\x11';
            pcVar11[-5] = '\0';
            pcVar11[-4] = '\0';
            pcVar11[-3] = '\0';
            pcVar11[-2] = '\0';
            pcVar11[-1] = '\0';
            __assert_fail("_size == _sizew",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-diag.c"
                          ,0x117,
                          "int fy_vdiag(struct fy_diag *, const struct fy_diag_ctx *, const char *, struct __va_list_tag *)"
                         );
          }
          pcVar11[-8] = 'R';
          pcVar11[-7] = -0x5e;
          pcVar11[-6] = '\x11';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          sVar7 = strlen(pcVar11);
          pcVar14 = pcVar11 + sVar7;
          while ((pcVar8 = pcVar11, pcVar11 < pcVar14 && (pcVar14[-1] == '\n'))) {
            pcVar14 = pcVar14 + -1;
            *pcVar14 = '\0';
          }
        }
      }
      if (((diag->cfg).field_0x20 & 4) == 0) {
        pcVar14 = (char *)0x0;
      }
      else {
        uVar1 = fydc->line;
        if (((int)uVar1 < 0) || (uVar2 = fydc->column, (int)uVar2 < 0)) {
          pcVar14 = (char *)0x0;
        }
        else {
          pcVar14 = (char *)0x0;
          pcVar11[-8] = -0x48;
          pcVar11[-7] = -0x5e;
          pcVar11[-6] = '\x11';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          iVar5 = snprintf((char *)0x0,0,"<%3d:%2d>%s",(ulong)uVar1,(ulong)uVar2,": ");
          if (iVar5 != -1) {
            pcVar14 = pcVar11 + -((long)iVar5 + 0x10U & 0xfffffffffffffff0);
            uVar1 = fydc->line;
            uVar2 = fydc->column;
            pcVar14[-8] = -5;
            pcVar14[-7] = -0x5e;
            pcVar14[-6] = '\x11';
            pcVar14[-5] = '\0';
            pcVar14[-4] = '\0';
            pcVar14[-3] = '\0';
            pcVar14[-2] = '\0';
            pcVar14[-1] = '\0';
            iVar6 = snprintf(pcVar14,(long)iVar5 + 1,"<%3d:%2d>%s",(ulong)uVar1,(ulong)uVar2,": ");
            if (iVar5 != iVar6) {
              *(code **)(pcVar14 + -8) = fy_diagf;
              __assert_fail("_size == _sizew",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-diag.c"
                            ,0x11c,
                            "int fy_vdiag(struct fy_diag *, const struct fy_diag_ctx *, const char *, struct __va_list_tag *)"
                           );
            }
            pcVar14[-8] = '\f';
            pcVar14[-7] = -0x5d;
            pcVar14[-6] = '\x11';
            pcVar14[-5] = '\0';
            pcVar14[-4] = '\0';
            pcVar14[-3] = '\0';
            pcVar14[-2] = '\0';
            pcVar14[-1] = '\0';
            sVar7 = strlen(pcVar14);
            pcVar19 = pcVar14 + sVar7;
            while ((pcVar11 = pcVar14, pcVar14 < pcVar19 && (pcVar19[-1] == '\n'))) {
              pcVar19 = pcVar19 + -1;
              *pcVar19 = '\0';
            }
          }
        }
      }
      uVar12 = (ulong)fVar15;
      pcVar19 = pcVar11;
      if (((diag->cfg).field_0x20 & 8) == 0) {
        pcVar10 = (char *)0x0;
      }
      else {
        if (fVar15 < FYET_MAX) {
          pcVar10 = *(char **)(fy_error_level_str_txt + uVar12 * 8);
        }
        else {
          pcVar10 = "*unknown*";
        }
        pcVar11[-8] = 'w';
        pcVar11[-7] = -0x5d;
        pcVar11[-6] = '\x11';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        iVar5 = snprintf((char *)0x0,0,"[%s]%s",pcVar10,": ");
        pcVar10 = (char *)0x0;
        if (iVar5 != -1) {
          lVar4 = -((long)iVar5 + 0x10U & 0xfffffffffffffff0);
          pcVar19 = pcVar11 + lVar4;
          if (fVar15 < FYET_MAX) {
            pcVar10 = *(char **)(fy_error_level_str_txt + uVar12 * 8);
          }
          else {
            pcVar10 = "*unknown*";
          }
          builtin_strncpy(pcVar11 + lVar4 + -8,"̣\x11",4);
          pcVar19[-4] = '\0';
          pcVar19[-3] = '\0';
          pcVar19[-2] = '\0';
          pcVar19[-1] = '\0';
          iVar6 = snprintf(pcVar19,(long)iVar5 + 1,"[%s]%s",pcVar10,": ");
          if (iVar5 != iVar6) {
            pcVar19[-8] = '\x0e';
            pcVar19[-7] = -0x5a;
            pcVar19[-6] = '\x11';
            pcVar19[-5] = '\0';
            pcVar19[-4] = '\0';
            pcVar19[-3] = '\0';
            pcVar19[-2] = '\0';
            pcVar19[-1] = '\0';
            __assert_fail("_size == _sizew",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-diag.c"
                          ,0x120,
                          "int fy_vdiag(struct fy_diag *, const struct fy_diag_ctx *, const char *, struct __va_list_tag *)"
                         );
          }
          builtin_strncpy(pcVar11 + lVar4 + -8,"ݣ\x11",4);
          pcVar19[-4] = '\0';
          pcVar19[-3] = '\0';
          pcVar19[-2] = '\0';
          pcVar19[-1] = '\0';
          sVar7 = strlen(pcVar19);
          pcVar11 = pcVar19 + sVar7;
          while ((pcVar10 = pcVar19, pcVar19 < pcVar11 && (pcVar11[-1] == '\n'))) {
            pcVar11 = pcVar11 + -1;
            *pcVar11 = '\0';
          }
        }
      }
      if (((diag->cfg).field_0x20 & 0x10) == 0) {
        pcVar11 = (char *)0x0;
      }
      else {
        if ((ulong)fydc->module < 8) {
          pcVar11 = *(char **)(fy_error_module_str_txt + (ulong)fydc->module * 8);
        }
        else {
          pcVar11 = "*unknown*";
        }
        pcVar19[-8] = 'B';
        pcVar19[-7] = -0x5c;
        pcVar19[-6] = '\x11';
        pcVar19[-5] = '\0';
        pcVar19[-4] = '\0';
        pcVar19[-3] = '\0';
        pcVar19[-2] = '\0';
        pcVar19[-1] = '\0';
        iVar5 = snprintf((char *)0x0,0,"<%s>%s",pcVar11,": ");
        pcVar11 = (char *)0x0;
        if (iVar5 != -1) {
          pcVar19 = pcVar19 + -((long)iVar5 + 0x10U & 0xfffffffffffffff0);
          if ((ulong)fydc->module < 8) {
            pcVar11 = *(char **)(fy_error_module_str_txt + (ulong)fydc->module * 8);
          }
          else {
            pcVar11 = "*unknown*";
          }
          pcVar19[-8] = -0x5c;
          pcVar19[-7] = -0x5c;
          pcVar19[-6] = '\x11';
          pcVar19[-5] = '\0';
          pcVar19[-4] = '\0';
          pcVar19[-3] = '\0';
          pcVar19[-2] = '\0';
          pcVar19[-1] = '\0';
          iVar6 = snprintf(pcVar19,(long)iVar5 + 1,"<%s>%s",pcVar11,": ");
          if (iVar5 != iVar6) {
            pcVar19[-8] = '-';
            pcVar19[-7] = -0x5a;
            pcVar19[-6] = '\x11';
            pcVar19[-5] = '\0';
            pcVar19[-4] = '\0';
            pcVar19[-3] = '\0';
            pcVar19[-2] = '\0';
            pcVar19[-1] = '\0';
            __assert_fail("_size == _sizew",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-diag.c"
                          ,0x124,
                          "int fy_vdiag(struct fy_diag *, const struct fy_diag_ctx *, const char *, struct __va_list_tag *)"
                         );
          }
          pcVar19[-8] = -0x4b;
          pcVar19[-7] = -0x5c;
          pcVar19[-6] = '\x11';
          pcVar19[-5] = '\0';
          pcVar19[-4] = '\0';
          pcVar19[-3] = '\0';
          pcVar19[-2] = '\0';
          pcVar19[-1] = '\0';
          sVar7 = strlen(pcVar19);
          pcVar13 = pcVar19 + sVar7;
          while ((pcVar11 = pcVar19, pcVar19 < pcVar13 && (pcVar13[-1] == '\n'))) {
            pcVar13 = pcVar13 + -1;
            *pcVar13 = '\0';
          }
        }
      }
      pcVar9 = "";
      pcVar13 = "";
      if (fVar15 < FYET_MAX) {
        pcVar9 = "";
        pcVar13 = "";
        if (((diag->cfg).field_0x20 & 1) != 0) {
          pcVar13 = (&PTR_anon_var_dwarf_e628_00153bc0)[uVar12];
          pcVar9 = "\x1b[0m";
        }
      }
      uVar17 = 0;
      uVar12 = 0;
      pcVar16 = "";
      if (pcVar8 != (char *)0x0) {
        uVar12 = (ulong)(uint)(diag->cfg).source_width;
        pcVar16 = pcVar8;
      }
      pcVar8 = "";
      if (pcVar14 != (char *)0x0) {
        uVar17 = (ulong)(uint)(diag->cfg).position_width;
        pcVar8 = pcVar14;
      }
      uVar18 = 0;
      uVar20 = 0;
      pcVar14 = "";
      if (pcVar10 != (char *)0x0) {
        uVar20 = (ulong)(uint)(diag->cfg).type_width;
        pcVar14 = pcVar10;
      }
      pcVar10 = "";
      if (pcVar11 != (char *)0x0) {
        uVar18 = (ulong)(uint)(diag->cfg).module_width;
        pcVar10 = pcVar11;
      }
      *(char **)(pcVar19 + -0x10) = pcVar9;
      *(char **)(pcVar19 + -0x18) = local_50;
      *(char **)(pcVar19 + -0x20) = pcVar10;
      *(ulong *)(pcVar19 + -0x28) = uVar18;
      *(char **)(pcVar19 + -0x30) = pcVar14;
      *(ulong *)(pcVar19 + -0x38) = uVar20;
      *(char **)(pcVar19 + -0x40) = pcVar8;
      pcVar19[-0x48] = 'w';
      pcVar19[-0x47] = -0x5b;
      pcVar19[-0x46] = '\x11';
      pcVar19[-0x45] = '\0';
      pcVar19[-0x44] = '\0';
      pcVar19[-0x43] = '\0';
      pcVar19[-0x42] = '\0';
      pcVar19[-0x41] = '\0';
      iVar5 = fy_diag_printf(diag,"%s%*s%*s%*s%*s%s%s\n",pcVar13,uVar12,pcVar16,uVar17);
      iVar5 = (uint)(0 < iVar5) + iVar5;
    }
    if (((diag->field_0x3c & 1) == 0) && (FYET_WARNING < fydc->level)) {
      diag->field_0x3c = diag->field_0x3c | 1;
    }
  }
  return iVar5;
}

Assistant:

int fy_vdiag(struct fy_diag *diag, const struct fy_diag_ctx *fydc,
             const char *fmt, va_list ap) {
    char *msg = NULL;
    char *source = NULL, *position = NULL, *typestr = NULL, *modulestr = NULL;
    const char *file_stripped = NULL;
    const char *color_start = NULL, *color_end = NULL;
    enum fy_error_type level;
    int rc;

    if (!diag || !fydc || !fmt)
        return -1;

    level = fydc->level;

    /* turn errors into notices while not reset */
    if (level >= FYET_ERROR && diag->on_error)
        level = FYET_NOTICE;

    if (level < diag->cfg.level) {
        rc = 0;
        goto out;
    }

    /* check module enable mask */
    if (!(diag->cfg.module_mask & FY_BIT(fydc->module))) {
        rc = 0;
        goto out;
    }

    msg = alloca_vsprintf(fmt, ap);

    /* source part */
    if (diag->cfg.show_source) {
        if (fydc->source_file) {
            file_stripped = strrchr(fydc->source_file, '/');
            if (!file_stripped)
                file_stripped = fydc->source_file;
            else
                file_stripped++;
        } else
            file_stripped = "";
        source = alloca_sprintf("%s:%d @%s()%s",
                                file_stripped, fydc->source_line, fydc->source_func, " ");
    }

    /* position part */
    if (diag->cfg.show_position && fydc->line >= 0 && fydc->column >= 0)
        position = alloca_sprintf("<%3d:%2d>%s", fydc->line, fydc->column, ": ");

    /* type part */
    if (diag->cfg.show_type)
        typestr = alloca_sprintf("[%s]%s", fy_error_level_str(level), ": ");

    /* module part */
    if (diag->cfg.show_module)
        modulestr = alloca_sprintf("<%s>%s", fy_error_module_str(fydc->module), ": ");

    if (diag->cfg.colorize) {
        switch (level) {
            case FYET_DEBUG:
                color_start = "\x1b[37m";    /* normal white */
                break;
            case FYET_INFO:
                color_start = "\x1b[37;1m";    /* bright white */
                break;
            case FYET_NOTICE:
                color_start = "\x1b[34;1m";    /* bright blue */
                break;
            case FYET_WARNING:
                color_start = "\x1b[33;1m";    /* bright yellow */
                break;
            case FYET_ERROR:
                color_start = "\x1b[31;1m";    /* bright red */
                break;
            default:    /* handles FYET_MAX */
                break;
        }
        if (color_start)
            color_end = "\x1b[0m";
    }

    rc = fy_diag_printf(diag, "%s" "%*s" "%*s" "%*s" "%*s" "%s" "%s\n",
                        color_start ?: "",
                        source ? diag->cfg.source_width : 0, source ?: "",
                        position ? diag->cfg.position_width : 0, position ?: "",
                        typestr ? diag->cfg.type_width : 0, typestr ?: "",
                        modulestr ? diag->cfg.module_width : 0, modulestr ?: "",
                        msg,
                        color_end ?: "");

    if (rc > 0)
        rc++;

    out:
    /* if it's the first error we're generating set the
     * on_error flag until the top caller clears it
     */
    if (!diag->on_error && fydc->level >= FYET_ERROR)
        diag->on_error = true;

    return rc;
}